

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEADevice.h
# Opt level: O0

char * FindNMEASentence(char *sentencebegin,char *str)

{
  size_t sVar1;
  char *pcVar2;
  char *foundstr;
  char *ptr;
  char *str_local;
  char *sentencebegin_local;
  
  sentencebegin_local = strstr(str,sentencebegin);
  if (sentencebegin_local == (char *)0x0) {
    sentencebegin_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(sentencebegin);
    pcVar2 = strstr(sentencebegin_local + sVar1,"\r");
    if (pcVar2 == (char *)0x0) {
      sentencebegin_local = (char *)0x0;
    }
  }
  return sentencebegin_local;
}

Assistant:

inline char* FindNMEASentence(char* sentencebegin, char* str)
{
	char* ptr = NULL;
	char* foundstr = NULL;

	ptr = strstr(str, sentencebegin);
	if (!ptr)
	{
		// Could not find the beginning of the sentence.
		return NULL;
	}

	// Save the position of the beginning of the sentence.
	foundstr = ptr;

	// Check if the sentence is complete.
	ptr = strstr(foundstr+strlen(sentencebegin), "\r");
	if (!ptr)
	{
		// The sentence is incomplete.
		return NULL;
	}

	return foundstr;
}